

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

void __thiscall
ggml::cpu::aarch64::tensor_traits<block_iq4_nl,_4L,_4L,_(ggml_type)8>::forward_mul_mat_id
          (tensor_traits<block_iq4_nl,_4L,_4L,_(ggml_type)8> *this,ggml_compute_params *params,
          ggml_tensor *op)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 *puVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  int64_t iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ggml_from_float_t p_Var20;
  undefined8 uVar21;
  int iVar22;
  ggml_type_traits_cpu *pgVar23;
  long lVar24;
  ggml_threadpool *pgVar25;
  long lVar26;
  long lVar27;
  void *__s;
  float *s;
  void *vx;
  long in_RDX;
  int *in_RSI;
  char *src1_col;
  int64_t i2;
  int64_t i1;
  int64_t i12_1;
  int64_t i11_1;
  int id_1;
  mmid_row_mapping row_mapping;
  int ir1;
  int64_t src0_cur_end;
  int64_t src0_cur_start;
  int64_t nr1;
  char *src0_cur;
  int64_t cne1;
  int cur_a;
  int32_t i02;
  int32_t id;
  int32_t iid1;
  int64_t i11;
  int64_t i12;
  mmid_row_mapping *matrix_rows;
  int64_t *matrix_row_counts;
  char *wdata_src1_end;
  char *wdata;
  size_t nbw3;
  size_t nbw2;
  size_t nbw1;
  int n_as;
  int n_ids;
  ggml_from_float_t from_float;
  int nth;
  int ith;
  size_t nb3;
  size_t nb2;
  size_t nb1;
  size_t nb0;
  int64_t ne3;
  int64_t ne2;
  int64_t ne1;
  int64_t ne0;
  size_t nb13;
  size_t nb12;
  size_t nb11;
  size_t nb10;
  int64_t ne13;
  int64_t ne12;
  int64_t ne11;
  int64_t ne10;
  size_t nb03;
  size_t nb02;
  size_t nb01;
  size_t nb00;
  int64_t ne03;
  int64_t ne02;
  int64_t ne01;
  int64_t ne00;
  ggml_tensor *dst;
  ggml_tensor *ids;
  ggml_tensor *src1;
  ggml_tensor *src0;
  int in_stack_fffffffffffffdfc;
  void *in_stack_fffffffffffffe00;
  float *in_stack_fffffffffffffe10;
  ggml_threadpool *tp;
  int local_1a4;
  int iStack_1a0;
  int local_19c;
  int local_170;
  int local_160;
  int local_15c;
  long local_158;
  long local_150;
  
  puVar4 = *(undefined4 **)(in_RDX + 0x98);
  piVar5 = *(int **)(in_RDX + 0xa0);
  lVar6 = *(long *)(in_RDX + 0xa8);
  lVar7 = *(long *)(puVar4 + 6);
  uVar8 = *(undefined8 *)(puVar4 + 8);
  lVar26 = *(long *)(puVar4 + 10);
  lVar27 = *(long *)(puVar4 + 0xc);
  iVar9 = *(int64_t *)(piVar5 + 4);
  lVar10 = *(long *)(piVar5 + 6);
  lVar11 = *(long *)(piVar5 + 8);
  lVar12 = *(long *)(piVar5 + 10);
  tp = *(ggml_threadpool **)(piVar5 + 0xc);
  lVar13 = *(long *)(piVar5 + 0xe);
  lVar14 = *(long *)(piVar5 + 0x10);
  lVar15 = *(long *)(in_RDX + 0x28);
  uVar16 = *(ulong *)(in_RDX + 0x30);
  uVar17 = *(ulong *)(in_RDX + 0x38);
  uVar18 = *(ulong *)(in_RDX + 0x40);
  uVar19 = *(ulong *)(in_RDX + 0x48);
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  pgVar23 = ggml_get_type_traits_cpu(GGML_TYPE_Q8_0);
  p_Var20 = pgVar23->from_float;
  lVar24 = ggml_type_size(*puVar4);
  if (lVar27 != lVar24) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x180e,"GGML_ASSERT(%s) failed","nb00 == ggml_type_size(src0->type)");
  }
  pgVar25 = (ggml_threadpool *)ggml_type_size(*piVar5);
  if (tp != pgVar25) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x180f,"GGML_ASSERT(%s) failed","nb10 == ggml_type_size(src1->type)");
  }
  if (uVar16 != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x1812,"GGML_ASSERT(%s) failed","nb0 == sizeof(float)");
  }
  if (uVar17 < uVar16) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x1813,"GGML_ASSERT(%s) failed","nb0 <= nb1");
  }
  if (uVar18 < uVar17) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x1814,"GGML_ASSERT(%s) failed","nb1 <= nb2");
  }
  if (uVar19 < uVar18) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x1815,"GGML_ASSERT(%s) failed","nb2 <= nb3");
  }
  if (lVar26 != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x1817,"GGML_ASSERT(%s) failed","ne03 == 1");
  }
  if (lVar12 != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x1818,"GGML_ASSERT(%s) failed","ne13 == 1");
  }
  if (lVar15 != 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x1819,"GGML_ASSERT(%s) failed","ne3 == 1");
  }
  if (*piVar5 != 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x181b,"GGML_ASSERT(%s) failed","src1->type == GGML_TYPE_F32");
  }
  uVar21 = *(undefined8 *)(lVar6 + 0x10);
  iVar22 = (int)uVar8;
  lVar26 = ggml_row_size(8);
  lVar27 = lVar26 * lVar10;
  if (*(ulong *)(in_RSI + 2) <
      (lVar27 * lVar11 + 7U & 0xfffffffffffffff8) + (long)iVar22 * 8 + iVar22 * lVar11 * 8) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
               ,0x182b,"GGML_ASSERT(%s) failed",
               "params->wsize >= (GGML_PAD(nbw3, sizeof(int64_t)) + n_as * sizeof(int64_t) + n_as * ne12 * sizeof(mmid_row_mapping))"
              );
  }
  lVar12 = *(long *)(in_RSI + 4);
  __s = (void *)(lVar12 + (lVar27 * lVar11 + 7U & 0xfffffffffffffff8));
  for (local_150 = 0; local_150 < lVar11; local_150 = local_150 + 1) {
    for (local_158 = (long)iVar1; local_158 < lVar10; local_158 = iVar2 + local_158) {
      (*p_Var20)((float *)(*(long *)(piVar5 + 0x3e) + local_150 * lVar14 + local_158 * lVar13),
                 (void *)(lVar12 + local_150 * lVar27 + local_158 * lVar26),iVar9);
    }
  }
  if (iVar1 == 0) {
    memset(__s,0,(long)iVar22 << 3);
    for (local_15c = 0; (long)local_15c < *(long *)(lVar6 + 0x18); local_15c = local_15c + 1) {
      for (local_160 = 0; local_160 < (int)uVar21; local_160 = local_160 + 1) {
        iVar3 = *(int *)(*(long *)(lVar6 + 0xf8) + (long)local_15c * *(long *)(lVar6 + 0x38) +
                        (long)local_160 * *(long *)(lVar6 + 0x30));
        if ((iVar3 < 0) || (iVar22 <= iVar3)) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
                     ,0x1848,"GGML_ASSERT(%s) failed","i02 >= 0 && i02 < n_as");
        }
        *(ulong *)((long)__s +
                  (iVar3 * lVar11 + *(long *)((long)__s + (long)iVar3 * 8)) * 8 + (long)iVar22 * 8)
             = CONCAT44(local_15c,local_160);
        *(long *)((long)__s + (long)iVar3 * 8) = *(long *)((long)__s + (long)iVar3 * 8) + 1;
      }
    }
  }
  ggml_barrier(tp);
  local_170 = 0;
  do {
    if (iVar22 <= local_170) {
      return;
    }
    lVar6 = *(long *)((long)__s + (long)local_170 * 8);
    if (lVar6 != 0) {
      s = (float *)((iVar1 * lVar7) / (long)iVar2);
      vx = (void *)(((iVar1 + 1) * lVar7) / (long)iVar2);
      if ((long)s % 4 != 0) {
        in_stack_fffffffffffffe10 = s + 1;
        s = (float *)((long)in_stack_fffffffffffffe10 - (long)s % 4);
      }
      if ((long)vx % 4 != 0) {
        in_stack_fffffffffffffe00 = (void *)((long)vx + 4);
        vx = (void *)((long)in_stack_fffffffffffffe00 - (long)vx % 4);
      }
      if ((long)vx <= (long)s) {
        return;
      }
      for (local_19c = 0; local_19c < lVar6; local_19c = local_19c + 1) {
        uVar8 = *(undefined8 *)
                 ((long)__s + (local_170 * lVar11 + (long)local_19c) * 8 + (long)iVar22 * 8);
        local_1a4 = (int)uVar8;
        iStack_1a0 = (int)((ulong)uVar8 >> 0x20);
        gemv<block_iq4_nl,4l,4l,(ggml_type)8>
                  ((int)((ulong)tp >> 0x20),s,(size_t)in_stack_fffffffffffffe10,vx,
                   in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,
                   (int)lVar12 +
                   (int)((long)local_1a4 % lVar10) * (int)lVar26 + iStack_1a0 * (int)lVar27);
      }
    }
    local_170 = local_170 + 1;
  } while( true );
}

Assistant:

void forward_mul_mat_id(ggml_compute_params * params, ggml_tensor * op) {
        const ggml_tensor * src0 = op->src[0];
        const ggml_tensor * src1 = op->src[1];
        const ggml_tensor * ids  = op->src[2];
        ggml_tensor *       dst  = op;

        GGML_TENSOR_BINARY_OP_LOCALS

        const int ith = params->ith;
        const int nth = params->nth;

        const ggml_from_float_t from_float = ggml_get_type_traits_cpu(PARAM_TYPE)->from_float;

        // we don't support permuted src0 or src1
        GGML_ASSERT(nb00 == ggml_type_size(src0->type));
        GGML_ASSERT(nb10 == ggml_type_size(src1->type));

        // dst cannot be transposed or permuted
        GGML_ASSERT(nb0 == sizeof(float));
        GGML_ASSERT(nb0 <= nb1);
        GGML_ASSERT(nb1 <= nb2);
        GGML_ASSERT(nb2 <= nb3);

        GGML_ASSERT(ne03 == 1);
        GGML_ASSERT(ne13 == 1);
        GGML_ASSERT(ne3  == 1);

        GGML_ASSERT(src1->type == GGML_TYPE_F32);

        // row groups
        const int n_ids = ids->ne[0]; // n_expert_used
        const int n_as  = ne02;       // n_expert

        const size_t nbw1 = ggml_row_size(PARAM_TYPE, ne10);
        const size_t nbw2 = nbw1*ne11;
        const size_t nbw3 = nbw2*ne12;

        struct mmid_row_mapping {
            int32_t i1;
            int32_t i2;
        };

        GGML_ASSERT(params->wsize >= (GGML_PAD(nbw3, sizeof(int64_t)) + n_as * sizeof(int64_t) +
                                      n_as * ne12 * sizeof(mmid_row_mapping)));

        auto * wdata             = (char *)     params->wdata;
        auto * wdata_src1_end    = (char *)     wdata + GGML_PAD(nbw3, sizeof(int64_t));
        auto * matrix_row_counts = (int64_t *) (wdata_src1_end); // [n_as]

        struct mmid_row_mapping * matrix_rows = (struct mmid_row_mapping *) (matrix_row_counts + n_as);  // [n_as][ne12]

        // src1: float32 => param type
        for (int64_t i12 = 0; i12 < ne12; ++i12) {
            for (int64_t i11 = ith; i11 < ne11; i11 += nth) {
                from_float((float *)((char *) src1->data + i12 * nb12 + i11 * nb11),
                           (void *)               (wdata + i12 * nbw2 + i11 * nbw1),
                           ne10);
            }
        }

#define MMID_MATRIX_ROW(row_id, i1) matrix_rows[(row_id) * ne12 + (i1)]

        if (ith == 0) {
            // initialize matrix_row_counts
            memset(matrix_row_counts, 0, n_as * sizeof(int64_t));

            // group rows by src0 matrix
            for (int32_t iid1 = 0; iid1 < ids->ne[1]; ++iid1) {
                for (int32_t id = 0; id < n_ids; ++id) {
                    const int32_t i02 =
                        *(const int32_t *) ((const char *) ids->data + iid1 * ids->nb[1] + id * ids->nb[0]);

                    GGML_ASSERT(i02 >= 0 && i02 < n_as);

                    MMID_MATRIX_ROW(i02, matrix_row_counts[i02]) = { id, iid1 };
                    matrix_row_counts[i02] += 1;
                }
            }
        }

        ggml_barrier(params->threadpool);

        // compute each matrix multiplication in sequence
        for (int cur_a = 0; cur_a < n_as; ++cur_a) {
            const int64_t cne1 = matrix_row_counts[cur_a];

            if (cne1 == 0) {
                continue;
            }

            const auto * src0_cur = (const char *) src0->data + cur_a*nb02;

            //const int64_t nr0 = ne01; // src0 rows
            const int64_t nr1 = cne1; // src1 rows

            int64_t src0_cur_start = (ith * ne01) / nth;
            int64_t src0_cur_end   = ((ith + 1) * ne01) / nth;

            src0_cur_start = (src0_cur_start % NB_COLS) ? src0_cur_start + NB_COLS - (src0_cur_start % NB_COLS) : src0_cur_start;
            src0_cur_end   = (src0_cur_end   % NB_COLS) ? src0_cur_end   + NB_COLS - (src0_cur_end   % NB_COLS) : src0_cur_end;

            if (src0_cur_start >= src0_cur_end) {
                return;
            }

            for (int ir1 = 0; ir1 < nr1; ir1++) {
                struct mmid_row_mapping row_mapping = MMID_MATRIX_ROW(cur_a, ir1);

                const int id = row_mapping.i1; // selected expert index

                const int64_t i11 = id % ne11;
                const int64_t i12 = row_mapping.i2; // row index in src1

                const int64_t i1 = id;  // selected expert index
                const int64_t i2 = i12; // row

                const auto * src1_col = (const char *) wdata + (i11 * nbw1 + i12 * nbw2);

                gemv<BLOC_TYPE, INTER_SIZE, NB_COLS, PARAM_TYPE>(ne00,
                        (float *)((char *) dst->data + (i1 * nb1 + i2 * nb2)) + src0_cur_start, ne01,
                        src0_cur + src0_cur_start * nb01,
                        src1_col, 1, src0_cur_end - src0_cur_start);
            }
        }
#undef MMID_MATRIX_ROW
    }